

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unary_operations.hpp
# Opt level: O2

rt_expression_interface<double> *
viennamath::diff_impl<viennamath::rt_expression_interface<double>,double>(long *e,long param_2)

{
  char cVar1;
  long lVar2;
  rt_expression_interface<double> *prVar3;
  long *plVar4;
  _func_int **pp_Var5;
  _func_int **pp_Var6;
  expression_not_differentiable_exception *this;
  allocator<char> local_49;
  string local_48;
  
  if (param_2 != 0) {
    lVar2 = __dynamic_cast(param_2,&rt_expression_interface<double>::typeinfo,
                           &rt_function_symbol<viennamath::rt_expression_interface<double>>::
                            typeinfo,0);
    if (lVar2 != 0) {
      prVar3 = (rt_expression_interface<double> *)operator_new(0x10);
      prVar3->_vptr_rt_expression_interface = (_func_int **)&PTR__rt_expression_interface_00127da8;
      prVar3[1]._vptr_rt_expression_interface = (_func_int **)0x0;
      plVar4 = (long *)(**(code **)(*e + 0x90))(e,param_2);
      cVar1 = (**(code **)(*plVar4 + 0x58))(plVar4,prVar3);
      if (cVar1 == '\0') {
        (*prVar3->_vptr_rt_expression_interface[1])(prVar3);
        prVar3 = (rt_expression_interface<double> *)operator_new(0x18);
        pp_Var5 = (_func_int **)(**(code **)(*e + 0x90))(e,param_2);
        pp_Var6 = (_func_int **)operator_new(0x10);
        *pp_Var6 = (_func_int *)&PTR__op_interface_001289c8;
        prVar3->_vptr_rt_expression_interface = (_func_int **)&PTR__rt_unary_expr_00127ce8;
        prVar3[1]._vptr_rt_expression_interface = pp_Var5;
        prVar3[2]._vptr_rt_expression_interface = pp_Var6;
      }
      else {
        (**(code **)(*plVar4 + 8))(plVar4);
      }
      return prVar3;
    }
  }
  this = (expression_not_differentiable_exception *)__cxa_allocate_exception(0x28);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,"Cannot differentiate gradient operator!",&local_49);
  expression_not_differentiable_exception::expression_not_differentiable_exception(this,&local_48);
  __cxa_throw(this,&expression_not_differentiable_exception::typeinfo,
              expression_not_differentiable_exception::~expression_not_differentiable_exception);
}

Assistant:

InterfaceType * diff_impl(const InterfaceType * e, op_gradient<NumericT>, const InterfaceType * diff_var)
  {
    typedef rt_function_symbol<InterfaceType>  FunctionSymbolType;
    const FunctionSymbolType * ptr = dynamic_cast< const FunctionSymbolType *>(diff_var);
    if (ptr != NULL)
    {
      InterfaceType * c0 = new rt_constant<NumericT, InterfaceType>(0);
      InterfaceType * new_expr = e->diff(diff_var);

      if (new_expr->deep_equal(c0)) // grad(0) is directly compressed to 0
      {
        delete new_expr;
        return c0;
      }

      // return grad(...)
      delete c0;
      return new rt_unary_expr<InterfaceType>(e->diff(diff_var), new op_unary<op_gradient<NumericT>, InterfaceType>());
    }

    throw expression_not_differentiable_exception("Cannot differentiate gradient operator!");
    return NULL;
  }